

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sms_Apu.cpp
# Opt level: O2

void __thiscall Sms_Square::run(Sms_Square *this,blip_time_t time,blip_time_t end_time)

{
  uint uVar1;
  Blip_Buffer *buf;
  int iVar2;
  int iVar3;
  uint t;
  int iVar4;
  
  iVar3 = (this->super_Sms_Osc).volume;
  if ((iVar3 == 0) || (this->period < 0x81)) {
    iVar3 = (this->super_Sms_Osc).last_amp;
    if (iVar3 != 0) {
      Blip_Synth<12,_1>::offset(this->synth,time,-iVar3,(this->super_Sms_Osc).output);
      (this->super_Sms_Osc).last_amp = 0;
    }
    iVar3 = this->period;
    t = end_time;
    if ((iVar3 != 0) && (t = time + (this->super_Sms_Osc).delay, (int)t < end_time)) {
      iVar2 = (int)(~t + end_time + iVar3) / iVar3;
      this->phase = this->phase + iVar2 & 1;
      t = iVar2 * iVar3 + t;
    }
  }
  else {
    iVar2 = -iVar3;
    if (this->phase != 0) {
      iVar2 = iVar3;
    }
    iVar3 = iVar2 - (this->super_Sms_Osc).last_amp;
    if (iVar3 != 0) {
      (this->super_Sms_Osc).last_amp = iVar2;
      Blip_Synth<12,_1>::offset(this->synth,time,iVar3,(this->super_Sms_Osc).output);
    }
    t = time + (this->super_Sms_Osc).delay;
    if ((int)t < end_time) {
      buf = (this->super_Sms_Osc).output;
      iVar3 = iVar2 * 2;
      iVar2 = iVar2 * -2;
      do {
        iVar4 = iVar3;
        Blip_Synth<12,_1>::offset_inline(this->synth,t,iVar2,buf);
        t = t + this->period;
        uVar1 = this->phase;
        this->phase = uVar1 ^ 1;
        iVar3 = iVar2;
        iVar2 = iVar4;
      } while ((int)t < end_time);
      iVar3 = (this->super_Sms_Osc).volume;
      iVar2 = -iVar3;
      if (uVar1 != 1) {
        iVar2 = iVar3;
      }
      (this->super_Sms_Osc).last_amp = iVar2;
    }
  }
  (this->super_Sms_Osc).delay = t - end_time;
  return;
}

Assistant:

void Sms_Square::run( blip_time_t time, blip_time_t end_time )
{
	if ( !volume || period <= 128 )
	{
		// ignore 16kHz and higher
		if ( last_amp )
		{
			synth->offset( time, -last_amp, output );
			last_amp = 0;
		}
		time += delay;
		if ( !period )
		{
			time = end_time;
		}
		else if ( time < end_time )
		{
			// keep calculating phase
			int count = (end_time - time + period - 1) / period;
			phase = (phase + count) & 1;
			time += count * period;
		}
	}
	else
	{
		int amp = phase ? volume : -volume;
		{
			int delta = amp - last_amp;
			if ( delta )
			{
				last_amp = amp;
				synth->offset( time, delta, output );
			}
		}
		
		time += delay;
		if ( time < end_time )
		{
			Blip_Buffer* const output = this->output;
			int delta = amp * 2;
			do
			{
				delta = -delta;
				synth->offset_inline( time, delta, output );
				time += period;
				phase ^= 1;
			}
			while ( time < end_time );
			this->last_amp = phase ? volume : -volume;
		}
	}
	delay = time - end_time;
}